

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listReporters(Config *param_1)

{
  _Rb_tree_node_base *p_Var1;
  pointer pbVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  pointer pbVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  Text wrapper;
  string local_e8;
  long local_c8;
  size_t local_c0;
  undefined1 *local_b8;
  _Rb_tree_node_base *local_b0;
  TextAttributes local_a8;
  Text local_88;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available reports:\n",0x13);
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])(pIVar4);
  local_c8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                       ((long *)CONCAT44(extraout_var,iVar3));
  p_Var7 = *(_Rb_tree_node_base **)(local_c8 + 0x18);
  p_Var1 = (_Rb_tree_node_base *)(local_c8 + 8);
  if (p_Var7 != p_Var1) {
    p_Var5 = p_Var7;
    p_Var9 = (_Base_ptr)0x0;
    do {
      p_Var10 = p_Var5[1]._M_parent;
      if (p_Var5[1]._M_parent < p_Var9) {
        p_Var10 = p_Var9;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      p_Var9 = p_Var10;
    } while (p_Var5 != p_Var1);
    if (p_Var7 != p_Var1) {
      local_b8 = &p_Var10->field_0x7;
      local_c0 = 0x48 - (long)p_Var10;
      do {
        (**(code **)(**(long **)(p_Var7 + 2) + 0x18))(&local_e8);
        local_a8.tabChar = '\t';
        local_a8.initialIndent = 0;
        local_a8.indent = (size_t)local_b8;
        local_a8.width = local_c0;
        Tbc::Text::Text(&local_88,&local_e8,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_e8,((char)p_Var10 + '\x02') - (char)p_Var7[1]._M_parent);
        local_b0 = p_Var7;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        pbVar2 = local_88.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar8 = local_88.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2;
            pbVar8 = pbVar8 + 1) {
          if (pbVar8 != local_88.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        p_Var7 = local_b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88.lines);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
          operator_delete(local_88.str._M_dataplus._M_p);
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != p_Var1);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return *(size_t *)(local_c8 + 0x28);
}

Assistant:

inline bool isOk( ResultWas::OfType resultType ) {
        return ( resultType & ResultWas::FailureBit ) == 0;
    }